

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof_recent.c
# Opt level: O0

void prof_recent_alloc_max_init(void)

{
  prof_recent_alloc_max.repr = duckdb_je_opt_prof_recent_alloc_max;
  return;
}

Assistant:

static void
prof_recent_alloc_max_init(void) {
	atomic_store_zd(&prof_recent_alloc_max, opt_prof_recent_alloc_max,
	    ATOMIC_RELAXED);
}